

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O2

void strbuf_append_string(strbuf_t *s,char *str)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  
  uVar3 = s->length;
  iVar1 = ~uVar3 + s->size;
  for (; cVar2 = *str, cVar2 != '\0'; str = str + 1) {
    if (iVar1 < 1) {
      strbuf_resize(s,uVar3 + 1);
      uVar3 = s->length;
      iVar1 = ~uVar3 + s->size;
      cVar2 = *str;
    }
    s->buf[(int)uVar3] = cVar2;
    uVar3 = s->length + 1;
    s->length = uVar3;
    iVar1 = iVar1 + -1;
  }
  return;
}

Assistant:

void strbuf_append_string(strbuf_t *s, const char *str)
{
    int space, i;

    space = strbuf_empty_length(s);

    for (i = 0; str[i]; i++) {
        if (space < 1) {
            strbuf_resize(s, s->length + 1);
            space = strbuf_empty_length(s);
        }

        s->buf[s->length] = str[i];
        s->length++;
        space--;
    }
}